

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::stepBy(QDateTimeEdit *this,int steps)

{
  bool bVar1;
  int iVar2;
  QDateTimeEditPrivate *pQVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  int i;
  QDateTimeEditPrivate *d;
  bool in_stack_00000087;
  int in_stack_00000088;
  int in_stack_0000008c;
  QDateTimeEditPrivate *in_stack_00000090;
  QAbstractSpinBoxPrivate *in_stack_ffffffffffffff50;
  QDateTimeEditPrivate *str;
  undefined8 in_stack_ffffffffffffff58;
  QFlagsStorage<QDateTimeEdit::Section> lhs;
  QDateTimeEditPrivate *this_00;
  QDateTimeEditPrivate *this_01;
  QAbstractSpinBoxPrivate *in_stack_ffffffffffffff68;
  undefined1 *puVar5;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar6;
  int local_68;
  undefined1 local_48 [24];
  undefined1 local_30 [40];
  long local_8;
  
  lhs.i = (Int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QDateTimeEdit *)0x55d204);
  bVar1 = QAbstractSpinBoxPrivate::specialValue(in_stack_ffffffffffffff50);
  if (bVar1) {
    displayedSections((QDateTimeEdit *)in_stack_ffffffffffffff50);
    bVar1 = ::operator!=((QFlags<QDateTimeEdit::Section>)lhs.i,(Section)in_stack_ffffffffffffff50);
    if (bVar1) {
      for (local_68 = 0;
          qVar4 = QList<QDateTimeParser::SectionNode>::size
                            ((QList<QDateTimeParser::SectionNode> *)&pQVar3->field_0x408),
          local_68 < qVar4; local_68 = local_68 + 1) {
        iVar2 = QDateTimeParser::sectionType((int)pQVar3 + 0x3d8);
        if (iVar2 != 1) {
          *(int *)&pQVar3->field_0x3e0 = local_68;
          break;
        }
      }
    }
  }
  this_01 = (QDateTimeEditPrivate *)local_30;
  uVar6 = 0;
  str = pQVar3;
  QDateTimeEditPrivate::stepBy
            (in_stack_00000090,in_stack_0000008c,in_stack_00000088,in_stack_00000087);
  this_00 = (QDateTimeEditPrivate *)(local_30 + 8);
  ::QVariant::QVariant((QVariant *)this_00,(QDateTime *)this_01);
  QAbstractSpinBoxPrivate::setValue
            (in_stack_ffffffffffffff68,(QVariant *)this_01,(EmitPolicy)((ulong)this_00 >> 0x20),
             SUB81((ulong)this_00 >> 0x18,0));
  ::QVariant::~QVariant((QVariant *)this_00);
  QDateTime::~QDateTime((QDateTime *)this_01);
  puVar5 = local_48;
  (**(code **)(*(long *)&(pQVar3->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))();
  QDateTimeEditPrivate::updateCache(this_01,(QVariant *)this_00,(QString *)str);
  QString::~QString((QString *)0x55d36b);
  QDateTimeEditPrivate::setSelected
            ((QDateTimeEditPrivate *)CONCAT44(uVar6,in_stack_ffffffffffffff80),
             (int)((ulong)puVar5 >> 0x20),SUB81((ulong)puVar5 >> 0x18,0));
  QDateTimeEditPrivate::updateTimeZone(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEdit::stepBy(int steps)
{
    Q_D(QDateTimeEdit);
#ifdef QT_KEYPAD_NAVIGATION
    // with keypad navigation and not editFocus, left right change the date/time by a fixed amount.
    if (QApplicationPrivate::keypadNavigationEnabled() && !hasEditFocus()) {
        // if date based, shift by day.  else shift by 15min
        if (d->sections & DateSections_Mask) {
            setDateTime(dateTime().addDays(steps));
        } else {
            int minutes = time().hour()*60 + time().minute();
            int blocks = minutes/15;
            blocks += steps;
            /* rounding involved */
            if (minutes % 15) {
                if (steps < 0) {
                    blocks += 1; // do one less step;
                }
            }

            minutes = blocks * 15;

            /* need to take wrapping into account */
            if (!d->wrapping) {
                int max_minutes = d->maximum.toTime().hour()*60 + d->maximum.toTime().minute();
                int min_minutes = d->minimum.toTime().hour()*60 + d->minimum.toTime().minute();

                if (minutes >= max_minutes) {
                    setTime(maximumTime());
                    return;
                } else if (minutes <= min_minutes) {
                    setTime(minimumTime());
                    return;
                }
            }
            setTime(QTime(minutes/60, minutes%60));
        }
        return;
    }
#endif
    // don't optimize away steps == 0. This is the only way to select
    // the currentSection in Qt 4.1.x
    if (d->specialValue() && displayedSections() != AmPmSection) {
        for (int i=0; i<d->sectionNodes.size(); ++i) {
            if (d->sectionType(i) != QDateTimeParser::AmPmSection) {
                d->currentSectionIndex = i;
                break;
            }
        }
    }
    d->setValue(d->stepBy(d->currentSectionIndex, steps, false), EmitIfChanged);
    d->updateCache(d->value, d->displayText());

    d->setSelected(d->currentSectionIndex);
    d->updateTimeZone();
}